

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileiconprovider.cpp
# Opt level: O2

QIcon __thiscall
QFileIconProviderPrivate::getIcon(QFileIconProviderPrivate *this,StandardPixmap name)

{
  char cVar1;
  QStyle *pQVar2;
  int in_EDX;
  undefined4 in_register_00000034;
  long lVar3;
  QIcon *this_00;
  long in_FS_OFFSET;
  undefined8 uStack_30;
  QIcon QStack_28;
  long local_20;
  
  lVar3 = CONCAT44(in_register_00000034,name);
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  switch(in_EDX) {
  case 0xd:
    this_00 = (QIcon *)(lVar3 + 0x88);
    cVar1 = QIcon::isNull();
    if (cVar1 != '\0') {
      pQVar2 = QApplication::style();
      lVar3 = *(long *)pQVar2;
      uStack_30 = 0xd;
LAB_002b9b81:
      (**(code **)(lVar3 + 0x100))(&QStack_28,pQVar2,uStack_30,0,0);
      QIcon::operator=(this_00,&QStack_28);
      QIcon::~QIcon(&QStack_28);
    }
    break;
  case 0xe:
    this_00 = (QIcon *)(lVar3 + 0x90);
    cVar1 = QIcon::isNull();
    if (cVar1 != '\0') {
      pQVar2 = QApplication::style();
      lVar3 = *(long *)pQVar2;
      uStack_30 = 0xe;
      goto LAB_002b9b81;
    }
    break;
  case 0xf:
    this_00 = (QIcon *)(lVar3 + 0x80);
    cVar1 = QIcon::isNull();
    if (cVar1 != '\0') {
      pQVar2 = QApplication::style();
      lVar3 = *(long *)pQVar2;
      uStack_30 = 0xf;
      goto LAB_002b9b81;
    }
    break;
  case 0x10:
    this_00 = (QIcon *)(lVar3 + 0x60);
    cVar1 = QIcon::isNull();
    if (cVar1 != '\0') {
      pQVar2 = QApplication::style();
      lVar3 = *(long *)pQVar2;
      uStack_30 = 0x10;
      goto LAB_002b9b81;
    }
    break;
  case 0x11:
    this_00 = (QIcon *)(lVar3 + 0x58);
    cVar1 = QIcon::isNull();
    if (cVar1 != '\0') {
      pQVar2 = QApplication::style();
      lVar3 = *(long *)pQVar2;
      uStack_30 = 0x11;
      goto LAB_002b9b81;
    }
    break;
  case 0x12:
    this_00 = (QIcon *)(lVar3 + 0x68);
    cVar1 = QIcon::isNull();
    if (cVar1 != '\0') {
      pQVar2 = QApplication::style();
      lVar3 = *(long *)pQVar2;
      uStack_30 = 0x12;
      goto LAB_002b9b81;
    }
    break;
  case 0x13:
  case 0x15:
  case 0x16:
  case 0x18:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
switchD_002b99a1_caseD_13:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QIcon::QIcon((QIcon *)this);
      return (QIcon)(QIconPrivate *)this;
    }
    goto LAB_002b9bcf;
  case 0x14:
    this_00 = (QIcon *)(lVar3 + 0x78);
    cVar1 = QIcon::isNull();
    if (cVar1 != '\0') {
      pQVar2 = QApplication::style();
      lVar3 = *(long *)pQVar2;
      uStack_30 = 0x14;
      goto LAB_002b9b81;
    }
    break;
  case 0x17:
    this_00 = (QIcon *)(lVar3 + 0x50);
    cVar1 = QIcon::isNull();
    if (cVar1 != '\0') {
      pQVar2 = QApplication::style();
      lVar3 = *(long *)pQVar2;
      uStack_30 = 0x17;
      goto LAB_002b9b81;
    }
    break;
  case 0x19:
    this_00 = (QIcon *)(lVar3 + 0x38);
    cVar1 = QIcon::isNull();
    if (cVar1 != '\0') {
      pQVar2 = QApplication::style();
      lVar3 = *(long *)pQVar2;
      uStack_30 = 0x19;
      goto LAB_002b9b81;
    }
    break;
  case 0x1a:
    this_00 = (QIcon *)(lVar3 + 0x40);
    cVar1 = QIcon::isNull();
    if (cVar1 != '\0') {
      pQVar2 = QApplication::style();
      lVar3 = *(long *)pQVar2;
      uStack_30 = 0x1a;
      goto LAB_002b9b81;
    }
    break;
  case 0x26:
    this_00 = (QIcon *)(lVar3 + 0x48);
    cVar1 = QIcon::isNull();
    if (cVar1 != '\0') {
      pQVar2 = QApplication::style();
      lVar3 = *(long *)pQVar2;
      uStack_30 = 0x26;
      goto LAB_002b9b81;
    }
    break;
  default:
    if (in_EDX != 0x38) goto switchD_002b99a1_caseD_13;
    this_00 = (QIcon *)(lVar3 + 0xa0);
    cVar1 = QIcon::isNull();
    if (cVar1 != '\0') {
      pQVar2 = QApplication::style();
      lVar3 = *(long *)pQVar2;
      uStack_30 = 0x38;
      goto LAB_002b9b81;
    }
  }
  QIcon::QIcon((QIcon *)this,this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QIcon)(QIconPrivate *)this;
  }
LAB_002b9bcf:
  __stack_chk_fail();
}

Assistant:

QIcon QFileIconProviderPrivate::getIcon(QStyle::StandardPixmap name) const
{
    switch (name) {
    case QStyle::SP_FileIcon:
        if (file.isNull())
            file = QApplication::style()->standardIcon(name);
        return file;
    case QStyle::SP_FileLinkIcon:
        if (fileLink.isNull())
            fileLink = QApplication::style()->standardIcon(name);
        return fileLink;
    case QStyle::SP_DirIcon:
        if (directory.isNull())
            directory = QApplication::style()->standardIcon(name);
        return directory;
    case QStyle::SP_DirLinkIcon:
        if (directoryLink.isNull())
            directoryLink = QApplication::style()->standardIcon(name);
        return directoryLink;
    case QStyle::SP_DriveHDIcon:
        if (harddisk.isNull())
            harddisk = QApplication::style()->standardIcon(name);
        return harddisk;
    case QStyle::SP_DriveFDIcon:
        if (floppy.isNull())
            floppy = QApplication::style()->standardIcon(name);
        return floppy;
    case QStyle::SP_DriveCDIcon:
        if (cdrom.isNull())
            cdrom = QApplication::style()->standardIcon(name);
        return cdrom;
    case QStyle::SP_DriveNetIcon:
        if (network.isNull())
            network = QApplication::style()->standardIcon(name);
        return network;
    case QStyle::SP_ComputerIcon:
        if (computer.isNull())
            computer = QApplication::style()->standardIcon(name);
        return computer;
    case QStyle::SP_DesktopIcon:
        if (desktop.isNull())
            desktop = QApplication::style()->standardIcon(name);
        return desktop;
    case QStyle::SP_TrashIcon:
        if (trashcan.isNull())
            trashcan = QApplication::style()->standardIcon(name);
        return trashcan;
    case QStyle::SP_DirHomeIcon:
        if (home.isNull())
            home = QApplication::style()->standardIcon(name);
        return home;
    default:
        return QIcon();
    }
    return QIcon();
}